

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darknet2ncnn.cpp
# Opt level: O2

string * format<char_const*>(string *__return_storage_ptr__,char *fmt,char *args)

{
  int iVar1;
  
  iVar1 = snprintf((char *)0x0,0,fmt,args);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  snprintf((__return_storage_ptr__->_M_dataplus)._M_p,(long)iVar1 + 1,fmt,args);
  return __return_storage_ptr__;
}

Assistant:

std::string format(const char* fmt, Args... args)
{
    size_t size = snprintf(nullptr, 0, fmt, args...);
    std::string buf;
    buf.reserve(size + 1);
    buf.resize(size);
    snprintf(&buf[0], size + 1, fmt, args...);
    return buf;
}